

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_64.c
# Opt level: O0

sljit_s32 sljit_emit_enter(sljit_compiler *compiler,sljit_s32 options,sljit_s32 arg_types,
                          sljit_s32 scratches,sljit_s32 saveds,sljit_s32 fscratches,
                          sljit_s32 fsaveds,sljit_s32 param_8)

{
  int iVar1;
  sljit_s32 sVar2;
  int iVar3;
  undefined1 *puVar4;
  int local_58;
  int local_54;
  int local_4c;
  char *local_48;
  sljit_u8 *inst;
  sljit_s32 saved_register_size;
  sljit_s32 size;
  sljit_s32 tmp;
  sljit_s32 i;
  sljit_s32 args;
  sljit_s32 fscratches_local;
  sljit_s32 saveds_local;
  sljit_s32 scratches_local;
  sljit_s32 arg_types_local;
  sljit_s32 options_local;
  sljit_compiler *compiler_local;
  
  if (compiler->error == 0) {
    set_emit_enter(compiler,options,arg_types,scratches,saveds,fscratches,fsaveds,param_8);
    compiler->mode32 = 0;
    if (scratches < 7) {
      local_4c = 0;
    }
    else {
      local_4c = scratches + -7;
    }
    local_54 = saveds;
    if (5 < saveds) {
      local_54 = 6;
    }
    iVar1 = local_4c + local_54 + 1;
    if (saveds < 6) {
      local_58 = 0xe - saveds;
    }
    else {
      local_58 = 8;
    }
    for (size = 0xd; iVar3 = scratches, local_58 <= size; size = size + -1) {
      iVar3 = 1;
      if (7 < ""[size]) {
        iVar3 = 2;
      }
      puVar4 = (undefined1 *)ensure_buf(compiler,(long)(iVar3 + 1));
      if (puVar4 == (undefined1 *)0x0) {
        return compiler->error;
      }
      *puVar4 = (char)iVar3;
      compiler->size = (long)iVar3 + compiler->size;
      local_48 = puVar4 + 1;
      if (7 < ""[size]) {
        local_48 = puVar4 + 2;
        puVar4[1] = 'A';
      }
      *local_48 = ""[size] + 'P';
    }
    while (size = iVar3, 7 < size) {
      iVar3 = 1;
      if (7 < ""[size]) {
        iVar3 = 2;
      }
      puVar4 = (undefined1 *)ensure_buf(compiler,(long)(iVar3 + 1));
      if (puVar4 == (undefined1 *)0x0) {
        return compiler->error;
      }
      *puVar4 = (char)iVar3;
      compiler->size = (long)iVar3 + compiler->size;
      local_48 = puVar4 + 1;
      if (7 < ""[size]) {
        local_48 = puVar4 + 2;
        puVar4[1] = 'A';
      }
      *local_48 = ""[size] + 'P';
      iVar3 = size + -1;
    }
    sVar2 = get_arg_count(arg_types);
    if (0 < sVar2) {
      iVar3 = sVar2 * 3;
      puVar4 = (undefined1 *)ensure_buf(compiler,(long)(iVar3 + 1));
      if (puVar4 == (undefined1 *)0x0) {
        return compiler->error;
      }
      local_48 = puVar4 + 1;
      *puVar4 = (char)iVar3;
      compiler->size = (long)iVar3 + compiler->size;
      if (0 < sVar2) {
        *local_48 = 0x48;
        puVar4[2] = 0x8b;
        puVar4[3] = 0xdf;
        local_48 = puVar4 + 4;
      }
      if (1 < sVar2) {
        *local_48 = 0x4c;
        local_48[1] = 0x8b;
        local_48[2] = 0xfe;
        local_48 = local_48 + 3;
      }
      if (2 < sVar2) {
        *local_48 = 0x4c;
        local_48[1] = 0x8b;
        local_48[2] = 0xf2;
      }
    }
    iVar1 = (param_8 + iVar1 * 8 + 0xfU & 0xfffffff0) + iVar1 * -8;
    compiler->local_size = iVar1;
    if ((iVar1 < 1) ||
       (sVar2 = emit_non_cum_binary(compiler,0x2d2b2928,0xe,0,0xe,0,0x40,(long)iVar1), sVar2 == 0))
    {
      compiler_local._4_4_ = 0;
    }
    else {
      compiler_local._4_4_ = compiler->error;
    }
  }
  else {
    compiler_local._4_4_ = compiler->error;
  }
  return compiler_local._4_4_;
}

Assistant:

SLJIT_API_FUNC_ATTRIBUTE sljit_s32 sljit_emit_enter(struct sljit_compiler *compiler,
	sljit_s32 options, sljit_s32 arg_types, sljit_s32 scratches, sljit_s32 saveds,
	sljit_s32 fscratches, sljit_s32 fsaveds, sljit_s32 local_size)
{
	sljit_s32 args, i, tmp, size, saved_register_size;
	sljit_u8 *inst;

	CHECK_ERROR();
	CHECK(check_sljit_emit_enter(compiler, options, arg_types, scratches, saveds, fscratches, fsaveds, local_size));
	set_emit_enter(compiler, options, arg_types, scratches, saveds, fscratches, fsaveds, local_size);

	compiler->mode32 = 0;

#ifdef _WIN64
	/* Two/four register slots for parameters plus space for xmm6 register if needed. */
	if (fscratches >= 6 || fsaveds >= 1)
		compiler->locals_offset = 6 * sizeof(sljit_sw);
	else
		compiler->locals_offset = ((scratches > 2) ? 4 : 2) * sizeof(sljit_sw);
#endif

	/* Including the return address saved by the call instruction. */
	saved_register_size = GET_SAVED_REGISTERS_SIZE(scratches, saveds, 1);

	tmp = saveds < SLJIT_NUMBER_OF_SAVED_REGISTERS ? (SLJIT_S0 + 1 - saveds) : SLJIT_FIRST_SAVED_REG;
	for (i = SLJIT_S0; i >= tmp; i--) {
		size = reg_map[i] >= 8 ? 2 : 1;
		inst = (sljit_u8*)ensure_buf(compiler, 1 + size);
		FAIL_IF(!inst);
		INC_SIZE(size);
		if (reg_map[i] >= 8)
			*inst++ = REX_B;
		PUSH_REG(reg_lmap[i]);
	}

	for (i = scratches; i >= SLJIT_FIRST_SAVED_REG; i--) {
		size = reg_map[i] >= 8 ? 2 : 1;
		inst = (sljit_u8*)ensure_buf(compiler, 1 + size);
		FAIL_IF(!inst);
		INC_SIZE(size);
		if (reg_map[i] >= 8)
			*inst++ = REX_B;
		PUSH_REG(reg_lmap[i]);
	}

	args = get_arg_count(arg_types);

	if (args > 0) {
		size = args * 3;
		inst = (sljit_u8*)ensure_buf(compiler, 1 + size);
		FAIL_IF(!inst);

		INC_SIZE(size);

#ifndef _WIN64
		if (args > 0) {
			inst[0] = REX_W;
			inst[1] = MOV_r_rm;
			inst[2] = MOD_REG | (reg_map[SLJIT_S0] << 3) | 0x7 /* rdi */;
			inst += 3;
		}
		if (args > 1) {
			inst[0] = REX_W | REX_R;
			inst[1] = MOV_r_rm;
			inst[2] = MOD_REG | (reg_lmap[SLJIT_S1] << 3) | 0x6 /* rsi */;
			inst += 3;
		}
		if (args > 2) {
			inst[0] = REX_W | REX_R;
			inst[1] = MOV_r_rm;
			inst[2] = MOD_REG | (reg_lmap[SLJIT_S2] << 3) | 0x2 /* rdx */;
		}
#else
		if (args > 0) {
			inst[0] = REX_W;
			inst[1] = MOV_r_rm;
			inst[2] = MOD_REG | (reg_map[SLJIT_S0] << 3) | 0x1 /* rcx */;
			inst += 3;
		}
		if (args > 1) {
			inst[0] = REX_W;
			inst[1] = MOV_r_rm;
			inst[2] = MOD_REG | (reg_map[SLJIT_S1] << 3) | 0x2 /* rdx */;
			inst += 3;
		}
		if (args > 2) {
			inst[0] = REX_W | REX_B;
			inst[1] = MOV_r_rm;
			inst[2] = MOD_REG | (reg_map[SLJIT_S2] << 3) | 0x0 /* r8 */;
		}
#endif
	}

	local_size = ((local_size + SLJIT_LOCALS_OFFSET + saved_register_size + 15) & ~15) - saved_register_size;
	compiler->local_size = local_size;

#ifdef _WIN64
	if (local_size > 0) {
		if (local_size <= 4 * 4096) {
			if (local_size > 4096)
				EMIT_MOV(compiler, TMP_REG1, 0, SLJIT_MEM1(SLJIT_SP), -4096);
			if (local_size > 2 * 4096)
				EMIT_MOV(compiler, TMP_REG1, 0, SLJIT_MEM1(SLJIT_SP), -4096 * 2);
			if (local_size > 3 * 4096)
				EMIT_MOV(compiler, TMP_REG1, 0, SLJIT_MEM1(SLJIT_SP), -4096 * 3);
		}
		else {
			EMIT_MOV(compiler, SLJIT_R0, 0, SLJIT_SP, 0);
			EMIT_MOV(compiler, TMP_REG1, 0, SLJIT_IMM, (local_size - 1) >> 12);

			SLJIT_ASSERT (reg_map[SLJIT_R0] == 0);

			EMIT_MOV(compiler, TMP_REG2, 0, SLJIT_MEM1(SLJIT_R0), -4096);
			FAIL_IF(emit_non_cum_binary(compiler, BINARY_OPCODE(SUB),
				SLJIT_R0, 0, SLJIT_R0, 0, SLJIT_IMM, 4096));
			FAIL_IF(emit_non_cum_binary(compiler, BINARY_OPCODE(SUB),
				TMP_REG1, 0, TMP_REG1, 0, SLJIT_IMM, 1));

			inst = (sljit_u8*)ensure_buf(compiler, 1 + 2);
			FAIL_IF(!inst);

			INC_SIZE(2);
			inst[0] = JNE_i8;
			inst[1] = (sljit_s8) -19;
		}

		EMIT_MOV(compiler, TMP_REG1, 0, SLJIT_MEM1(SLJIT_SP), -local_size);
	}
#endif

	if (local_size > 0) {
		FAIL_IF(emit_non_cum_binary(compiler, BINARY_OPCODE(SUB),
			SLJIT_SP, 0, SLJIT_SP, 0, SLJIT_IMM, local_size));
	}

#ifdef _WIN64
	/* Save xmm6 register: movaps [rsp + 0x20], xmm6 */
	if (fscratches >= 6 || fsaveds >= 1) {
		inst = (sljit_u8*)ensure_buf(compiler, 1 + 5);
		FAIL_IF(!inst);
		INC_SIZE(5);
		*inst++ = GROUP_0F;
		sljit_unaligned_store_s32(inst, 0x20247429);
	}
#endif

	return SLJIT_SUCCESS;
}